

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

char16_t * __thiscall icu_63::number::impl::DecimalQuantity::checkHealth(DecimalQuantity *this)

{
  int8_t iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int i;
  int position;
  
  position = this->precision;
  if (this->usingBytes == true) {
    if (position == 0) {
      return L"Zero precision but we are in byte mode";
    }
    iVar3 = (this->fBCD).bcdBytes.len;
    if (iVar3 < position) {
      return L"Precision exceeds length of byte array";
    }
    iVar1 = getDigitPos(this,position + -1);
    if (iVar1 == '\0') {
      return L"Most significant digit is zero in byte mode";
    }
    iVar2 = 0;
    iVar1 = getDigitPos(this,0);
    if (iVar1 == '\0') {
LAB_0021b178:
      return L"Least significant digit is zero in long mode";
    }
    iVar4 = 0;
    if (0 < position) {
      iVar4 = position;
    }
    while (iVar4 != iVar2) {
      iVar1 = getDigitPos(this,iVar2);
      if ('\t' < iVar1) {
        return L"Digit exceeding 10 in byte array";
      }
      iVar2 = iVar2 + 1;
      if (iVar1 < '\0') {
        return L"Digit below 0 in byte array";
      }
    }
    while (iVar3 != position) {
      iVar1 = getDigitPos(this,position);
      position = position + 1;
      if (iVar1 != '\0') {
        return L"Nonzero digits outside of range in byte array";
      }
    }
  }
  else {
    if ((position == 0) && ((this->fBCD).bcdBytes.ptr != (int8_t *)0x0)) {
      return L"Value in bcdLong even though precision is zero";
    }
    if (0x10 < position) {
      return L"Precision exceeds length of long";
    }
    if (position != 0) {
      iVar1 = getDigitPos(this,position + -1);
      if (iVar1 == '\0') {
        return L"Most significant digit is zero in long mode";
      }
      iVar1 = getDigitPos(this,0);
      if (iVar1 == '\0') goto LAB_0021b178;
    }
    iVar2 = 0;
    iVar3 = 0;
    if (0 < position) {
      iVar3 = position;
    }
    while (iVar3 != iVar2) {
      iVar1 = getDigitPos(this,iVar2);
      if ('\t' < iVar1) {
        return L"Digit exceeding 10 in long";
      }
      iVar2 = iVar2 + 1;
      if (iVar1 < '\0') {
        return L"Digit below 0 in long (?!)";
      }
    }
    while (position < 0x10) {
      iVar1 = getDigitPos(this,position);
      position = position + 1;
      if (iVar1 != '\0') {
        return L"Nonzero digits outside of range in long";
      }
    }
  }
  return (char16_t *)0x0;
}

Assistant:

const char16_t* DecimalQuantity::checkHealth() const {
    if (usingBytes) {
        if (precision == 0) { return u"Zero precision but we are in byte mode"; }
        int32_t capacity = fBCD.bcdBytes.len;
        if (precision > capacity) { return u"Precision exceeds length of byte array"; }
        if (getDigitPos(precision - 1) == 0) { return u"Most significant digit is zero in byte mode"; }
        if (getDigitPos(0) == 0) { return u"Least significant digit is zero in long mode"; }
        for (int i = 0; i < precision; i++) {
            if (getDigitPos(i) >= 10) { return u"Digit exceeding 10 in byte array"; }
            if (getDigitPos(i) < 0) { return u"Digit below 0 in byte array"; }
        }
        for (int i = precision; i < capacity; i++) {
            if (getDigitPos(i) != 0) { return u"Nonzero digits outside of range in byte array"; }
        }
    } else {
        if (precision == 0 && fBCD.bcdLong != 0) {
            return u"Value in bcdLong even though precision is zero";
        }
        if (precision > 16) { return u"Precision exceeds length of long"; }
        if (precision != 0 && getDigitPos(precision - 1) == 0) {
            return u"Most significant digit is zero in long mode";
        }
        if (precision != 0 && getDigitPos(0) == 0) {
            return u"Least significant digit is zero in long mode";
        }
        for (int i = 0; i < precision; i++) {
            if (getDigitPos(i) >= 10) { return u"Digit exceeding 10 in long"; }
            if (getDigitPos(i) < 0) { return u"Digit below 0 in long (?!)"; }
        }
        for (int i = precision; i < 16; i++) {
            if (getDigitPos(i) != 0) { return u"Nonzero digits outside of range in long"; }
        }
    }

    // No error
    return nullptr;
}